

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

void wallet::PushParentDescriptors(CWallet *wallet,CScript *script_pubkey,UniValue *entry)

{
  bool bVar1;
  element_type *peVar2;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *in_RDX;
  CScript *in_RDI;
  long in_FS_OFFSET;
  WalletDescriptor *desc;
  vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *__range1;
  iterator __end1;
  iterator __begin1;
  UniValue parent_descs;
  UniValue *in_stack_fffffffffffffdf8;
  UniValue *in_stack_fffffffffffffe00;
  UniValue *in_stack_fffffffffffffe08;
  UniValue *in_stack_fffffffffffffe10;
  UniValue *in_stack_fffffffffffffe18;
  UniValue *val;
  UniValue *in_stack_fffffffffffffe38;
  UniValue *in_stack_fffffffffffffe40;
  CWallet *in_stack_fffffffffffffe60;
  undefined1 local_188 [144];
  undefined1 local_f8 [240];
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  std::__cxx11::string::string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffe10);
  UniValue::UniValue(in_stack_fffffffffffffe18,(VType)((ulong)in_stack_fffffffffffffe10 >> 0x20),
                     (string *)in_stack_fffffffffffffe08);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  CWallet::GetWalletDescriptors(in_stack_fffffffffffffe60,in_RDI);
  val = (UniValue *)local_188;
  std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::begin
            ((vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *)
             in_stack_fffffffffffffe00);
  std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::end
            ((vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *)
             in_stack_fffffffffffffe00);
  while( true ) {
    bVar1 = __gnu_cxx::
            operator==<wallet::WalletDescriptor_*,_std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>_>
                      ((__normal_iterator<wallet::WalletDescriptor_*,_std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>_>
                        *)in_stack_fffffffffffffe08,
                       (__normal_iterator<wallet::WalletDescriptor_*,_std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>_>
                        *)in_stack_fffffffffffffe00);
    if (((bVar1 ^ 0xffU) & 1) == 0) break;
    __gnu_cxx::
    __normal_iterator<wallet::WalletDescriptor_*,_std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>_>
    ::operator*((__normal_iterator<wallet::WalletDescriptor_*,_std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>_>
                 *)in_stack_fffffffffffffdf8);
    peVar2 = std::__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Descriptor,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                        )in_stack_fffffffffffffdf8);
    (*peVar2->_vptr_Descriptor[4])(local_f8,peVar2,0);
    UniValue::
    UniValue<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true>
              (in_stack_fffffffffffffe38,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)val);
    UniValue::push_back(in_stack_fffffffffffffe10,in_stack_fffffffffffffe08);
    UniValue::~UniValue(in_stack_fffffffffffffdf8);
    std::__cxx11::string::~string
              ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffdf8);
    __gnu_cxx::
    __normal_iterator<wallet::WalletDescriptor_*,_std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>_>
    ::operator++((__normal_iterator<wallet::WalletDescriptor_*,_std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>_>
                  *)in_stack_fffffffffffffdf8);
  }
  std::vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_>::~vector
            ((vector<wallet::WalletDescriptor,_std::allocator<wallet::WalletDescriptor>_> *)
             in_stack_fffffffffffffe08);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            (in_RDX,(char *)in_stack_fffffffffffffe40,(allocator<char> *)in_stack_fffffffffffffe38);
  UniValue::UniValue((UniValue *)(local_188 + 0x18),in_stack_fffffffffffffe00);
  UniValue::pushKV(in_stack_fffffffffffffe40,(string *)in_stack_fffffffffffffe38,val);
  UniValue::~UniValue(in_stack_fffffffffffffdf8);
  std::__cxx11::string::~string
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             in_stack_fffffffffffffdf8);
  std::allocator<char>::~allocator((allocator<char> *)&stack0xfffffffffffffe67);
  UniValue::~UniValue(in_stack_fffffffffffffdf8);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void PushParentDescriptors(const CWallet& wallet, const CScript& script_pubkey, UniValue& entry)
{
    UniValue parent_descs(UniValue::VARR);
    for (const auto& desc: wallet.GetWalletDescriptors(script_pubkey)) {
        parent_descs.push_back(desc.descriptor->ToString());
    }
    entry.pushKV("parent_descs", std::move(parent_descs));
}